

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsXmlParser.cpp
# Opt level: O0

void parseHeaderFooterAttribute(Header *header,QDomElement *element)

{
  QDomElement *pQVar1;
  byte bVar2;
  byte local_e2;
  QDomElement local_d0 [8];
  QFont font;
  QArrayDataPointer<char16_t> local_b8;
  QString local_a0;
  QArrayDataPointer<char16_t> local_78;
  QString local_60;
  QDomElement *local_48;
  QDomElement *element_local;
  Header *header_local;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_28;
  char16_t *local_20;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_10;
  
  str = L"font";
  header_local = (Header *)anon_var_dwarf_183b07;
  local_48 = element;
  element_local = (QDomElement *)header;
  local_28 = &local_78;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_78,(Data *)0x0,L"font",4);
  QString::QString(&local_60,&local_78);
  bVar2 = QDomElement::hasAttribute((QString *)element);
  pQVar1 = local_48;
  local_e2 = 1;
  if ((bVar2 & 1) == 0) {
    local_10 = &local_b8;
    str_1 = L"pointsize";
    local_20 = L"pointsize";
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_b8,(Data *)0x0,L"pointsize",9);
    QString::QString(&local_a0,&local_b8);
    local_e2 = QDomElement::hasAttribute((QString *)pQVar1);
    QString::~QString(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  }
  QString::~QString(&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  if ((local_e2 & 1) != 0) {
    parseFontAttributes(local_d0);
    KDReports::Header::setDefaultFont((Header *)element_local,(QFont *)local_d0);
    QFont::~QFont((QFont *)local_d0);
  }
  return;
}

Assistant:

static void parseHeaderFooterAttribute(KDReports::Header &header, const QDomElement &element)
{
    if (element.hasAttribute(QStringLiteral("font")) || element.hasAttribute(QStringLiteral("pointsize"))) {
        const QFont font = parseFontAttributes(element);
        header.setDefaultFont(font);
    }
}